

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type_ext.cpp
# Opt level: O3

void cs_impl::list_cs_ext::sort(list *lst,var *func)

{
  size_t *psVar1;
  list<cs_impl::any,std::allocator<cs_impl::any>> *this;
  _List_node_base *p_Var2;
  bool bVar3;
  long lVar4;
  long lVar5;
  _List_node_base *p_Var6;
  _List_node_base *p_Var7;
  list<cs_impl::any,std::allocator<cs_impl::any>> *__x;
  _List_node_base *p_Var8;
  bool bVar9;
  list<cs_impl::any,_std::allocator<cs_impl::any>_> __carry;
  list<cs_impl::any,_std::allocator<cs_impl::any>_> __tmp [64];
  _List_base<cs_impl::any,_std::allocator<cs_impl::any>_> local_658;
  anon_class_8_1_898bcfc2 local_640;
  _List_base<cs_impl::any,_std::allocator<cs_impl::any>_> local_638 [64];
  
  local_658._M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)&local_658;
  local_658._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&local_658;
  local_640.func = func;
  p_Var7 = (lst->super__List_base<cs_impl::any,_std::allocator<cs_impl::any>_>)._M_impl._M_node.
           super__List_node_base._M_next;
  if ((p_Var7 != (_List_node_base *)lst) && (p_Var7->_M_next != (_List_node_base *)lst)) {
    local_658._M_impl._M_node._M_size = 0;
    lVar4 = 0;
    do {
      lVar5 = (long)&local_638[0]._M_impl._M_node.super__List_node_base._M_next + lVar4;
      *(long *)((long)&local_638[0]._M_impl._M_node.super__List_node_base._M_prev + lVar4) = lVar5;
      *(long *)lVar5 = lVar5;
      *(undefined8 *)((long)&local_638[0]._M_impl._M_node._M_size + lVar4) = 0;
      lVar4 = lVar4 + 0x18;
    } while (lVar4 != 0x600);
    p_Var8 = (_List_node_base *)local_638;
    do {
      p_Var6 = p_Var8;
      p_Var8 = (_List_node_base *)local_638;
      if (p_Var7->_M_next != local_658._M_impl._M_node.super__List_node_base._M_next &&
          local_658._M_impl._M_node.super__List_node_base._M_next != p_Var7) {
        std::__detail::_List_node_base::_M_transfer
                  (local_658._M_impl._M_node.super__List_node_base._M_next,p_Var7);
        local_658._M_impl._M_node._M_size =
             (long)(_List_node_base **)local_658._M_impl._M_node._M_size + 1;
        psVar1 = &(lst->super__List_base<cs_impl::any,_std::allocator<cs_impl::any>_>)._M_impl.
                  _M_node._M_size;
        *psVar1 = *psVar1 - 1;
      }
      lVar4 = 0x18;
      if (p_Var8 == p_Var6) {
        bVar3 = true;
        p_Var7 = p_Var8;
      }
      else {
        do {
          bVar9 = p_Var8 == p_Var8->_M_next;
          bVar3 = !bVar9;
          if (bVar9) {
            lVar4 = 0;
            p_Var7 = p_Var8;
            break;
          }
          std::__cxx11::list<cs_impl::any,std::allocator<cs_impl::any>>::
          merge<cs_impl::list_cs_ext::sort(std::__cxx11::list<cs_impl::any,std::allocator<cs_impl::any>>&,cs_impl::any_const&)::__0>
                    ((list<cs_impl::any,std::allocator<cs_impl::any>> *)p_Var8,
                     (list<cs_impl::any,_std::allocator<cs_impl::any>_> *)&local_658,local_640);
          std::__detail::_List_node_base::swap((_List_node_base *)&local_658,p_Var8);
          p_Var2 = p_Var8[1]._M_next;
          p_Var8[1]._M_next = (_List_node_base *)local_658._M_impl._M_node._M_size;
          p_Var8 = (_List_node_base *)&p_Var8[1]._M_prev;
          p_Var7 = p_Var6;
          local_658._M_impl._M_node._M_size = (size_t)p_Var2;
        } while (p_Var8 != p_Var6);
      }
      std::__detail::_List_node_base::swap((_List_node_base *)&local_658,p_Var7);
      p_Var2 = p_Var7[1]._M_next;
      p_Var7[1]._M_next = (_List_node_base *)local_658._M_impl._M_node._M_size;
      p_Var8 = (_List_node_base *)((long)&p_Var6->_M_next + lVar4);
      p_Var7 = (lst->super__List_base<cs_impl::any,_std::allocator<cs_impl::any>_>)._M_impl._M_node.
               super__List_node_base._M_next;
      local_658._M_impl._M_node._M_size = (size_t)p_Var2;
    } while (p_Var7 != (_List_node_base *)lst);
    __x = (list<cs_impl::any,std::allocator<cs_impl::any>> *)local_638;
    while (this = __x + 0x18, (_List_node_base *)this != p_Var8) {
      std::__cxx11::list<cs_impl::any,std::allocator<cs_impl::any>>::
      merge<cs_impl::list_cs_ext::sort(std::__cxx11::list<cs_impl::any,std::allocator<cs_impl::any>>&,cs_impl::any_const&)::__0>
                (this,(list<cs_impl::any,_std::allocator<cs_impl::any>_> *)__x,local_640);
      __x = this;
    }
    p_Var7 = p_Var6 + 1;
    if (!bVar3) {
      p_Var7 = (_List_node_base *)&p_Var6[-1]._M_prev;
      p_Var6 = (_List_node_base *)&p_Var6[-2]._M_prev;
    }
    std::__detail::_List_node_base::swap((_List_node_base *)lst,p_Var6);
    p_Var8 = p_Var7->_M_next;
    p_Var7->_M_next =
         (_List_node_base *)
         (lst->super__List_base<cs_impl::any,_std::allocator<cs_impl::any>_>)._M_impl._M_node.
         _M_size;
    (lst->super__List_base<cs_impl::any,_std::allocator<cs_impl::any>_>)._M_impl._M_node._M_size =
         (size_t)p_Var8;
    lVar4 = 0x5e8;
    do {
      std::__cxx11::_List_base<cs_impl::any,_std::allocator<cs_impl::any>_>::_M_clear
                ((_List_base<cs_impl::any,_std::allocator<cs_impl::any>_> *)
                 ((long)&local_638[0]._M_impl._M_node.super__List_node_base._M_next + lVar4));
      lVar4 = lVar4 + -0x18;
    } while (lVar4 != -0x18);
    std::__cxx11::_List_base<cs_impl::any,_std::allocator<cs_impl::any>_>::_M_clear(&local_658);
  }
  return;
}

Assistant:

void sort(list &lst, const var &func)
		{
			lst.sort([&](const var &lhs, const var &rhs) -> bool {
				return invoke(func, lhs, rhs).const_val<boolean>();
			});
		}